

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

int __thiscall PP_Expression::shift_expression(PP_Expression *this)

{
  qsizetype *pqVar1;
  long lVar2;
  int iVar3;
  Token TVar4;
  int iVar5;
  
  iVar3 = additive_expression(this);
  lVar2 = (this->super_Parser).index;
  TVar4 = NOTOKEN;
  if (lVar2 < (this->super_Parser).symbols.d.size) {
    (this->super_Parser).index = lVar2 + 1;
    TVar4 = (this->super_Parser).symbols.d.ptr[lVar2].token;
  }
  if (TVar4 == LTLT) {
    iVar5 = shift_expression(this);
    iVar3 = iVar3 << ((byte)iVar5 & 0x1f);
  }
  else if (TVar4 == GTGT) {
    iVar5 = shift_expression(this);
    iVar3 = iVar3 >> ((byte)iVar5 & 0x1f);
  }
  else {
    pqVar1 = &(this->super_Parser).index;
    *pqVar1 = *pqVar1 + -1;
  }
  return iVar3;
}

Assistant:

int PP_Expression::shift_expression()
{
    int value = additive_expression();
    switch (next()) {
    case PP_LTLT:
        return value << shift_expression();
    case PP_GTGT:
        return value >> shift_expression();
    default:
        prev();
        return value;
    }
}